

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

Interval<float> pbrt::Sin<float>(Interval<float> i)

{
  bool bVar1;
  float *pfVar2;
  float line;
  float fVar3;
  double dVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [64];
  char (*unaff_retaddr) [15];
  float *in_stack_00000008;
  char (*in_stack_00000010) [12];
  double *in_stack_00000018;
  float high;
  float low;
  double vb_1;
  float va_1;
  double vb;
  float va;
  undefined8 in_stack_ffffffffffffff78;
  Interval<float> in_stack_ffffffffffffff80;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  char (*in_stack_ffffffffffffffc8) [7];
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *fmt;
  Interval<float> IVar6;
  float local_10;
  float in_stack_fffffffffffffff4;
  undefined1 extraout_var [60];
  
  IVar6 = (Interval<float>)vmovlpd_avx(in_ZMM0._0_16_);
  line = Interval<float>::LowerBound((Interval<float> *)&stack0xffffffffffffffe8);
  fmt = (char *)0xbc9cd2b297d889bc;
  if (line < -1e-16) {
    LogFatal<char_const(&)[15],char_const(&)[7],char_const(&)[15],float&,char_const(&)[7],double&>
              ((LogLevel)in_stack_fffffffffffffff4,(char *)IVar6,(int)line,
               (char *)0xbc9cd2b297d889bc,
               (char (*) [15])CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,unaff_retaddr,in_stack_00000008,
               (char (*) [7])in_stack_00000010,in_stack_00000018);
  }
  fVar3 = Interval<float>::UpperBound((Interval<float> *)&stack0xffffffffffffffe8);
  if (fVar3 <= 6.2834997) {
    local_40 = 0.0;
    local_44 = Interval<float>::LowerBound((Interval<float> *)&stack0xffffffffffffffe8);
    pfVar2 = std::max<float>(&local_40,&local_44);
    dVar4 = std::sin((double)(ulong)(uint)*pfVar2);
    local_3c = SUB84(dVar4,0);
    auVar5._0_4_ = Interval<float>::UpperBound((Interval<float> *)&stack0xffffffffffffffe8);
    auVar5._4_60_ = extraout_var;
    dVar4 = std::sin(auVar5._0_8_);
    local_48 = SUB84(dVar4,0);
    if (local_48 < local_3c) {
      pstd::swap<float>(&local_3c,&local_48);
    }
    local_4c = -1.0;
    local_50 = NextFloatDown(in_stack_ffffffffffffff80.low);
    pfVar2 = std::max<float>(&local_4c,&local_50);
    local_3c = *pfVar2;
    local_54 = 1.0;
    local_58 = NextFloatUp(in_stack_ffffffffffffff80.low);
    pfVar2 = std::min<float>(&local_54,&local_58);
    local_48 = *pfVar2;
    bVar1 = InRange<float,float>
                      ((float)((ulong)in_stack_ffffffffffffff78 >> 0x20),in_stack_ffffffffffffff80);
    if (bVar1) {
      local_48 = 1.0;
    }
    bVar1 = InRange<float,float>
                      ((float)((ulong)in_stack_ffffffffffffff78 >> 0x20),in_stack_ffffffffffffff80);
    if (bVar1) {
      local_3c = -1.0;
    }
    Interval<float>::Interval
              ((Interval<float> *)in_stack_ffffffffffffff80,
               (float)((ulong)in_stack_ffffffffffffff78 >> 0x20),(float)in_stack_ffffffffffffff78);
    IVar6.high = in_stack_fffffffffffffff4;
    IVar6.low = local_10;
    return IVar6;
  }
  LogFatal<char_const(&)[15],char_const(&)[12],char_const(&)[15],float&,char_const(&)[12],double&>
            ((LogLevel)in_stack_fffffffffffffff4,(char *)IVar6,(int)line,fmt,
             (char (*) [15])CONCAT44(fVar3,in_stack_ffffffffffffffd0),
             (char (*) [12])0x4019224dbadf3b65,unaff_retaddr,in_stack_00000008,in_stack_00000010,
             in_stack_00000018);
}

Assistant:

PBRT_CPU_GPU inline Interval<Float> Sin(Interval<Float> i) {
    CHECK_GE(i.LowerBound(), -1e-16);
    CHECK_LE(i.UpperBound(), 2.0001 * Pi);
    Float low = std::sin(std::max<Float>(0, i.LowerBound()));
    Float high = std::sin(i.UpperBound());
    if (low > high)
        pstd::swap(low, high);
    low = std::max<Float>(-1, NextFloatDown(low));
    high = std::min<Float>(1, NextFloatUp(high));
    if (InRange(Pi / 2, i))
        high = 1;
    if (InRange((3.f / 2.f) * Pi, i))
        low = -1;

    return Interval<Float>(low, high);
}